

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

ParserResult * __thiscall
Catch::clara::detail::
invokeLambda<std::__cxx11::string,Catch::makeCommandLineParser(Catch::ConfigData&)::__9>
          (ParserResult *__return_storage_ptr__,detail *this,
          anon_class_8_1_50637480_for_m_lambda *lambda,string *arg)

{
  string *target;
  bool bVar1;
  undefined1 local_70 [8];
  ParserResult result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string *arg_local;
  anon_class_8_1_50637480_for_m_lambda *lambda_local;
  
  target = (string *)(result.m_errorMessage.field_2._M_local_buf + 8);
  ::std::__cxx11::string::string((string *)target);
  convertInto((ParserResult *)local_70,(string *)lambda,target);
  bVar1 = BasicResult::operator_cast_to_bool((BasicResult *)local_70);
  if (bVar1) {
    LambdaInvoker<Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>>::
    invoke<Catch::makeCommandLineParser(Catch::ConfigData&)::__9,std::__cxx11::string>
              (__return_storage_ptr__,
               (LambdaInvoker<Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>>
                *)this,(anon_class_8_1_50637480_for_m_lambda *)
                       ((long)&result.m_errorMessage.field_2 + 8),arg);
  }
  else {
    BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
              (__return_storage_ptr__,(BasicResult<Catch::clara::detail::ParseResultType> *)local_70
              );
  }
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult
            ((BasicResult<Catch::clara::detail::ParseResultType> *)local_70);
  ::std::__cxx11::string::~string((string *)(result.m_errorMessage.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

inline auto invokeLambda( L const &lambda, std::string const &arg ) -> ParserResult {
        ArgType temp{};
        auto result = convertInto( arg, temp );
        return !result
           ? result
           : LambdaInvoker<typename UnaryLambdaTraits<L>::ReturnType>::invoke( lambda, temp );
    }